

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<bool>::appendInitialize(QArrayDataPointer<bool> *this,qsizetype newSize)

{
  bool *pbVar1;
  long in_RSI;
  bool *in_RDI;
  bool *e;
  bool *b;
  
  begin((QArrayDataPointer<bool> *)0x44dd50);
  pbVar1 = begin((QArrayDataPointer<bool> *)0x44dd62);
  std::uninitialized_value_construct<bool*>(pbVar1 + in_RSI,in_RDI);
  *(long *)(in_RDI + 0x10) = in_RSI;
  return;
}

Assistant:

void appendInitialize(qsizetype newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize > this->size);
        Q_ASSERT(newSize - this->size <= this->freeSpaceAtEnd());

        T *const b = this->begin() + this->size;
        T *const e = this->begin() + newSize;
        q17::uninitialized_value_construct(b, e);
        this->size = newSize;
    }